

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O3

REF_STATUS ref_subdiv_unmark_one_of_two(REF_SUBDIV ref_subdiv,REF_INT e0,REF_INT e1)

{
  uint uVar1;
  REF_GRID pRVar2;
  REF_NODE pRVar3;
  REF_INT *pRVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  pRVar2 = ref_subdiv->grid;
  pRVar3 = pRVar2->node;
  pRVar4 = ref_subdiv->edge->e2n;
  uVar1 = pRVar4[e0 * 2];
  lVar11 = (long)(int)uVar1;
  lVar13 = -1;
  if (((-1 < lVar11) && ((int)uVar1 < pRVar3->max)) && (-1 < pRVar3->global[lVar11])) {
    lVar13 = pRVar3->global[lVar11];
  }
  uVar10 = pRVar4[(int)(e0 * 2 | 1)];
  lVar7 = (long)(int)uVar10;
  lVar8 = -1;
  if ((lVar7 < 0) || (iVar6 = pRVar3->max, iVar6 <= (int)uVar10)) {
LAB_00204dde:
    if ((int)uVar1 < 0) {
      lVar13 = -1;
    }
    else {
      iVar6 = pRVar3->max;
LAB_00204de7:
      lVar13 = -1;
      if (((int)uVar1 < iVar6) && (-1 < pRVar3->global[lVar11])) {
        lVar13 = pRVar3->global[lVar11];
      }
    }
    if ((int)uVar10 < 0) {
      lVar11 = -1;
      if ((-1 < (int)uVar1) && (-1 < lVar13)) {
        iVar6 = pRVar3->max;
        goto LAB_00204e5f;
      }
    }
    else {
      iVar6 = pRVar3->max;
      if ((int)uVar10 < iVar6) {
        lVar11 = pRVar3->global[lVar7];
        if (lVar11 < 0) {
          lVar11 = -1;
        }
        if (lVar13 <= lVar11) goto LAB_00204e64;
      }
      else {
        lVar11 = -1;
        if (lVar13 < 0) goto LAB_00204e7d;
      }
      lVar11 = -1;
      if (-1 < (int)uVar1) {
LAB_00204e5f:
        lVar11 = -1;
        uVar10 = uVar1;
        if ((int)uVar1 < iVar6) goto LAB_00204e64;
      }
    }
  }
  else {
    if (pRVar3->global[lVar7] <= lVar13) {
      lVar8 = -1;
      if (-1 < pRVar3->global[lVar7]) {
        lVar8 = pRVar3->global[lVar7];
      }
      goto LAB_00204dde;
    }
    lVar8 = -1;
    if (-1 < (int)uVar1) {
      if ((int)uVar1 < iVar6) {
        lVar8 = -1;
        if (-1 < pRVar3->global[lVar11]) {
          lVar8 = pRVar3->global[lVar11];
        }
      }
      goto LAB_00204de7;
    }
    lVar11 = -1;
    if (pRVar3->max <= (int)uVar10) goto LAB_00204e7d;
LAB_00204e64:
    lVar11 = -1;
    if (-1 < pRVar3->global[uVar10]) {
      lVar11 = pRVar3->global[uVar10];
    }
  }
LAB_00204e7d:
  uVar1 = pRVar4[e1 * 2];
  lVar7 = (long)(int)uVar1;
  lVar13 = -1;
  if ((-1 < lVar7) && ((int)uVar1 < pRVar3->max)) {
    lVar13 = -1;
    if (-1 < pRVar3->global[lVar7]) {
      lVar13 = pRVar3->global[lVar7];
    }
  }
  uVar10 = pRVar4[(int)(e1 * 2 | 1)];
  lVar9 = (long)(int)uVar10;
  lVar12 = -1;
  if ((lVar9 < 0) || (iVar6 = pRVar3->max, iVar6 <= (int)uVar10)) {
LAB_00204f19:
    if ((int)uVar1 < 0) {
      lVar13 = -1;
    }
    else {
      iVar6 = pRVar3->max;
LAB_00204f21:
      lVar13 = -1;
      if (((int)uVar1 < iVar6) && (-1 < pRVar3->global[lVar7])) {
        lVar13 = pRVar3->global[lVar7];
      }
    }
    if ((int)uVar10 < 0) {
      lVar7 = -1;
      if (((int)uVar1 < 0) || (lVar13 < 0)) goto LAB_00204fae;
      iVar6 = pRVar3->max;
    }
    else {
      iVar6 = pRVar3->max;
      if ((int)uVar10 < iVar6) {
        lVar7 = pRVar3->global[lVar9];
        if (lVar7 < 0) {
          lVar7 = -1;
        }
        if (lVar13 <= lVar7) goto LAB_00204f9c;
      }
      else {
        lVar7 = -1;
        if (lVar13 < 0) goto LAB_00204fae;
      }
      lVar7 = -1;
      if ((int)uVar1 < 0) goto LAB_00204fae;
    }
    lVar7 = -1;
    uVar10 = uVar1;
    if (iVar6 <= (int)uVar1) goto LAB_00204fae;
  }
  else {
    if (pRVar3->global[lVar9] <= lVar13) {
      lVar12 = -1;
      if (-1 < pRVar3->global[lVar9]) {
        lVar12 = pRVar3->global[lVar9];
      }
      goto LAB_00204f19;
    }
    lVar12 = -1;
    if (-1 < (int)uVar1) {
      if ((int)uVar1 < iVar6) {
        lVar12 = -1;
        if (-1 < pRVar3->global[lVar7]) {
          lVar12 = pRVar3->global[lVar7];
        }
      }
      goto LAB_00204f21;
    }
    lVar7 = -1;
    if (pRVar3->max <= (int)uVar10) goto LAB_00204fae;
  }
LAB_00204f9c:
  lVar7 = -1;
  if (-1 < pRVar3->global[uVar10]) {
    lVar7 = pRVar3->global[uVar10];
  }
LAB_00204fae:
  bVar5 = lVar8 < lVar12;
  if (lVar8 == lVar12) {
    bVar5 = lVar11 < lVar7;
  }
  if (bVar5) {
    e0 = e1;
  }
  ref_subdiv->mark[e0] = 0;
  if (ref_subdiv->debug == 0) {
    return (REF_STATUS)pRVar2;
  }
  iVar6 = printf("unmark one of two proc %d edges %d %d\n",(ulong)(uint)pRVar2->mpi->id);
  return iVar6;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_unmark_one_of_two(REF_SUBDIV ref_subdiv,
                                                       REF_INT e0, REF_INT e1) {
  REF_NODE ref_node = ref_grid_node(ref_subdiv_grid(ref_subdiv));
  REF_EDGE ref_edge = ref_subdiv_edge(ref_subdiv);
  REF_GLOB e0min, e0max;
  REF_GLOB e1min, e1max;

  /* unmark the edge with the smallest edge globals */
  e0min = MIN(ref_node_global(ref_node, ref_edge_e2n(ref_edge, 0, e0)),
              ref_node_global(ref_node, ref_edge_e2n(ref_edge, 1, e0)));
  e0max = MAX(ref_node_global(ref_node, ref_edge_e2n(ref_edge, 0, e0)),
              ref_node_global(ref_node, ref_edge_e2n(ref_edge, 1, e0)));
  e1min = MIN(ref_node_global(ref_node, ref_edge_e2n(ref_edge, 0, e1)),
              ref_node_global(ref_node, ref_edge_e2n(ref_edge, 1, e1)));
  e1max = MAX(ref_node_global(ref_node, ref_edge_e2n(ref_edge, 0, e1)),
              ref_node_global(ref_node, ref_edge_e2n(ref_edge, 1, e1)));
  if (e0min == e1min) {
    if (e0max < e1max) {
      ref_subdiv_mark(ref_subdiv, e1) = 0;
    } else {
      ref_subdiv_mark(ref_subdiv, e0) = 0;
    }
  } else {
    if (e0min < e1min) {
      ref_subdiv_mark(ref_subdiv, e1) = 0;
    } else {
      ref_subdiv_mark(ref_subdiv, e0) = 0;
    }
  }

  if (ref_subdiv->debug)
    printf("unmark one of two proc %d edges %d %d\n",
           ref_mpi_rank(ref_subdiv_mpi(ref_subdiv)), e0, e1);

  return REF_SUCCESS;
}